

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O2

BSDF * __thiscall
pbrt::HairMaterial::GetBSDF<pbrt::UniversalTextureEvaluator>
          (undefined8 param_1,ulong param_2,BSDF *__return_storage_ptr__,HairMaterial *this,
          SampledWavelengths *param_5,float *param_6,undefined8 param_7,undefined8 param_8,
          undefined8 param_9,ulong param_10,undefined8 param_11,undefined8 param_12,
          undefined8 param_13,undefined8 param_14,undefined8 param_15,undefined8 param_16)

{
  TextureEvalContext ctx;
  TextureEvalContext ctx_00;
  TextureEvalContext ctx_01;
  TextureEvalContext ctx_02;
  TextureEvalContext ctx_03;
  TextureEvalContext ctx_04;
  TextureEvalContext ctx_05;
  TextureEvalContext ctx_06;
  ulong uVar1;
  uintptr_t iptr;
  undefined1 auVar2 [16];
  undefined1 auVar3 [64];
  undefined1 auVar12 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar19 [56];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar20 [16];
  SampledSpectrum SVar21;
  UniversalTextureEvaluator local_14d;
  Float local_14c;
  Float local_148;
  uint local_144;
  Float local_140;
  Float local_13c;
  SampledSpectrum local_138;
  BxDFHandle local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  uintptr_t local_f8;
  uintptr_t local_f0;
  uintptr_t local_e8;
  uintptr_t local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  SampledSpectrum local_90;
  SampledSpectrum c;
  RGBSigmoidPolynomial RStack_70;
  Float FStack_64;
  DenselySampledSpectrum *pDStack_60;
  Float aFStack_58 [4];
  Float aFStack_48 [4];
  Float aFStack_38 [2];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  local_e0 = (this->beta_m).
             super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
             .bits;
  ctx._8_8_ = param_10;
  ctx.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_9;
  ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_11;
  ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_12;
  ctx._32_8_ = param_13;
  ctx._40_8_ = param_14;
  ctx._48_8_ = param_15;
  ctx._56_8_ = param_16;
  local_13c = UniversalTextureEvaluator::operator()(&local_14d,(FloatTextureHandle)&local_e0,ctx);
  local_e8 = (this->beta_n).
             super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
             .bits;
  ctx_00._8_8_ = param_10;
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_9;
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_11;
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_12;
  ctx_00._32_8_ = param_13;
  ctx_00._40_8_ = param_14;
  ctx_00._48_8_ = param_15;
  ctx_00._56_8_ = param_16;
  auVar3._0_4_ = UniversalTextureEvaluator::operator()
                           (&local_14d,(FloatTextureHandle)&local_e8,ctx_00);
  auVar3._4_60_ = extraout_var;
  auVar20 = vmaxss_avx(auVar3._0_16_,ZEXT416(0x3c23d70a));
  local_f0 = (this->alpha).
             super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
             .bits;
  local_14c = auVar20._0_4_;
  ctx_01._8_8_ = param_10;
  ctx_01.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_9;
  ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_11;
  ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_12;
  ctx_01._32_8_ = param_13;
  ctx_01._40_8_ = param_14;
  ctx_01._48_8_ = param_15;
  ctx_01._56_8_ = param_16;
  local_140 = UniversalTextureEvaluator::operator()(&local_14d,(FloatTextureHandle)&local_f0,ctx_01)
  ;
  local_f8 = (this->eta).
             super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
             .bits;
  ctx_02._8_8_ = param_10;
  ctx_02.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_9;
  ctx_02.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_11;
  ctx_02.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_12;
  ctx_02._32_8_ = param_13;
  ctx_02._40_8_ = param_14;
  ctx_02._48_8_ = param_15;
  ctx_02._56_8_ = param_16;
  local_148 = UniversalTextureEvaluator::operator()(&local_14d,(FloatTextureHandle)&local_f8,ctx_02)
  ;
  local_138.values.values._0_12_ = ZEXT812(0);
  local_138.values.values[3] = 0.0;
  uVar1 = (this->sigma_a).
          super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
          .bits;
  if ((uVar1 & 0xffffffffffff) != 0) {
    local_b8 = *(undefined8 *)(param_5->lambda).values;
    uStack_b0 = *(undefined8 *)((param_5->lambda).values + 2);
    uStack_a8 = *(undefined8 *)(param_5->pdf).values;
    uStack_a0 = *(undefined8 *)((param_5->pdf).values + 2);
    auVar12 = ZEXT856(param_10);
    auVar19 = ZEXT856(param_2);
    ctx_03._8_8_ = param_10;
    ctx_03.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_9;
    ctx_03.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_11;
    ctx_03.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_12;
    ctx_03._32_8_ = param_13;
    ctx_03._40_8_ = param_14;
    ctx_03._48_8_ = param_15;
    ctx_03._56_8_ = param_16;
    local_100 = uVar1;
    SVar21 = UniversalTextureEvaluator::operator()
                       (&local_14d,(SpectrumTextureHandle)&local_100,ctx_03,*param_5);
    auVar13._0_8_ = SVar21.values.values._8_8_;
    auVar13._8_56_ = auVar19;
    auVar4._0_8_ = SVar21.values.values._0_8_;
    auVar4._8_56_ = auVar12;
    c.values.values = (array<float,_4>)vmovlhps_avx(auVar4._0_16_,auVar13._0_16_);
    auVar12 = ZEXT856(c.values.values._8_8_);
    SVar21 = ClampZero(&c);
    auVar14._0_8_ = SVar21.values.values._8_8_;
    auVar14._8_56_ = auVar19;
    auVar2 = auVar14._0_16_;
    auVar5._0_8_ = SVar21.values.values._0_8_;
    auVar5._8_56_ = auVar12;
    auVar20 = auVar5._0_16_;
    goto LAB_003395cc;
  }
  uVar1 = (this->color).
          super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
          .bits;
  if ((uVar1 & 0xffffffffffff) != 0) {
    local_d8 = *(undefined8 *)(param_5->lambda).values;
    uStack_d0 = *(undefined8 *)((param_5->lambda).values + 2);
    uStack_c8 = *(undefined8 *)(param_5->pdf).values;
    uStack_c0 = *(undefined8 *)((param_5->pdf).values + 2);
    auVar12 = ZEXT856(param_10);
    auVar19 = ZEXT856(param_2);
    ctx_04._8_8_ = param_10;
    ctx_04.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_9;
    ctx_04.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_11;
    ctx_04.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_12;
    ctx_04._32_8_ = param_13;
    ctx_04._40_8_ = param_14;
    ctx_04._48_8_ = param_15;
    ctx_04._56_8_ = param_16;
    local_108 = uVar1;
    SVar21 = UniversalTextureEvaluator::operator()
                       (&local_14d,(SpectrumTextureHandle)&local_108,ctx_04,*param_5);
    auVar15._0_8_ = SVar21.values.values._8_8_;
    auVar15._8_56_ = auVar19;
    auVar6._0_8_ = SVar21.values.values._0_8_;
    auVar6._8_56_ = auVar12;
    local_90.values.values = (array<float,_4>)vmovlhps_avx(auVar6._0_16_,auVar15._0_16_);
    auVar12 = ZEXT856(local_90.values.values._8_8_);
    SVar21 = Clamp<int,int>(&local_90,0,1);
    auVar16._0_8_ = SVar21.values.values._8_8_;
    auVar16._8_56_ = auVar19;
    auVar7._0_8_ = SVar21.values.values._0_8_;
    auVar7._8_56_ = auVar12;
    c.values.values = (array<float,_4>)vmovlhps_avx(auVar7._0_16_,auVar16._0_16_);
    auVar12 = (undefined1  [56])0x0;
    SVar21 = HairBxDF::SigmaAFromReflectance(&c,local_14c,param_5);
    auVar17._0_8_ = SVar21.values.values._8_8_;
    auVar17._8_56_ = auVar19;
    auVar2 = auVar17._0_16_;
    auVar8._0_8_ = SVar21.values.values._0_8_;
    auVar8._8_56_ = auVar12;
    auVar20 = auVar8._0_16_;
    goto LAB_003395cc;
  }
  uVar1 = (this->eumelanin).
          super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
          .bits;
  if ((uVar1 & 0xffffffffffff) == 0) {
    uVar1 = (this->pheomelanin).
            super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
            .bits;
    if ((uVar1 & 0xffffffffffff) == 0) {
      LogFatal<char_const(&)[25]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/materials.h"
                 ,0x175,"Check failed: %s",(char (*) [25])"eumelanin || pheomelanin");
    }
    auVar20 = ZEXT816(0) << 0x40;
LAB_00339574:
    local_144 = auVar20._0_4_;
    ctx_06._8_8_ = param_10;
    ctx_06.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_9;
    ctx_06.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_11;
    ctx_06.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_12;
    ctx_06._32_8_ = param_13;
    ctx_06._40_8_ = param_14;
    ctx_06._48_8_ = param_15;
    ctx_06._56_8_ = param_16;
    local_118 = uVar1;
    auVar10._0_4_ =
         UniversalTextureEvaluator::operator()(&local_14d,(FloatTextureHandle)&local_118,ctx_06);
    auVar10._4_60_ = extraout_var_01;
    auVar2 = auVar10._0_16_;
    auVar20 = ZEXT416(local_144);
  }
  else {
    ctx_05._8_8_ = param_10;
    ctx_05.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_9;
    ctx_05.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_11;
    ctx_05.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_12;
    ctx_05._32_8_ = param_13;
    ctx_05._40_8_ = param_14;
    ctx_05._48_8_ = param_15;
    ctx_05._56_8_ = param_16;
    local_110 = uVar1;
    auVar9._0_4_ = UniversalTextureEvaluator::operator()
                             (&local_14d,(FloatTextureHandle)&local_110,ctx_05);
    auVar9._4_60_ = extraout_var_00;
    uVar1 = (this->pheomelanin).
            super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
            .bits;
    auVar2._0_12_ = ZEXT412(0);
    auVar2._12_4_ = 0;
    auVar20 = vmaxss_avx(auVar9._0_16_,auVar2);
    if ((uVar1 & 0xffffffffffff) != 0) goto LAB_00339574;
  }
  auVar2 = vmaxss_avx(auVar2,ZEXT816(0) << 0x40);
  auVar19 = ZEXT856(auVar2._8_8_);
  auVar12 = ZEXT856(auVar20._8_8_);
  HairBxDF::SigmaAFromConcentration((RGBSpectrum *)&c,auVar20._0_4_,auVar2._0_4_);
  SVar21 = RGBSpectrum::Sample((RGBSpectrum *)&c,param_5);
  auVar18._0_8_ = SVar21.values.values._8_8_;
  auVar18._8_56_ = auVar19;
  auVar2 = auVar18._0_16_;
  auVar11._0_8_ = SVar21.values.values._0_8_;
  auVar11._8_56_ = auVar12;
  auVar20 = auVar11._0_16_;
LAB_003395cc:
  local_138.values.values = (array<float,_4>)vmovlhps_avx(auVar20,auVar2);
  auVar20 = vmaxss_avx(ZEXT416((uint)local_13c),ZEXT416(0x3c23d70a));
  auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),ZEXT416((uint)param_14),
                           ZEXT416(0xbf800000));
  HairBxDF::HairBxDF((HairBxDF *)&c,auVar2._0_4_,local_148,&local_138,auVar20._0_4_,local_14c,
                     local_140);
  local_120.
  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
  .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
           )((ulong)param_6 | 0x7000000000000);
  param_6[4] = RStack_70.c0;
  param_6[5] = RStack_70.c1;
  param_6[6] = RStack_70.c2;
  param_6[7] = FStack_64;
  *(DenselySampledSpectrum **)(param_6 + 8) = pDStack_60;
  *(undefined8 *)(param_6 + 10) = aFStack_58._0_8_;
  *(undefined8 *)(param_6 + 0xc) = aFStack_58._8_8_;
  *(undefined8 *)(param_6 + 0xe) = aFStack_48._0_8_;
  *(undefined8 *)(param_6 + 0x10) = aFStack_48._8_8_;
  *(Float (*) [2])(param_6 + 0x12) = aFStack_38;
  *(undefined8 *)param_6 = c.values.values._0_8_;
  *(undefined8 *)(param_6 + 2) = c.values.values._8_8_;
  param_6[4] = RStack_70.c0;
  param_6[5] = RStack_70.c1;
  param_6[6] = RStack_70.c2;
  param_6[7] = FStack_64;
  *(DenselySampledSpectrum **)(param_6 + 8) = pDStack_60;
  *(undefined8 *)(param_6 + 10) = aFStack_58._0_8_;
  *(undefined8 *)(param_6 + 0xc) = aFStack_58._8_8_;
  *(undefined8 *)(param_6 + 0xe) = aFStack_48._0_8_;
  BSDF::BSDF(__return_storage_ptr__,(Vector3f *)&stack0x00000048,(Normal3f *)&stack0x00000054,
             (Normal3f *)&stack0x00000060,(Vector3f *)&stack0x0000006c,&local_120,local_148);
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU BSDF GetBSDF(TextureEvaluator texEval, MaterialEvalContext ctx,
                              SampledWavelengths &lambda, HairBxDF *bxdf) const {
        Float bm = std::max<Float>(1e-2, texEval(beta_m, ctx));
        Float bn = std::max<Float>(1e-2, texEval(beta_n, ctx));
        Float a = texEval(alpha, ctx);
        Float e = texEval(eta, ctx);

        SampledSpectrum sig_a;
        if (sigma_a)
            sig_a = ClampZero(texEval(sigma_a, ctx, lambda));
        else if (color) {
            SampledSpectrum c = Clamp(texEval(color, ctx, lambda), 0, 1);
            sig_a = HairBxDF::SigmaAFromReflectance(c, bn, lambda);
        } else {
            CHECK(eumelanin || pheomelanin);
            sig_a = HairBxDF::SigmaAFromConcentration(
                        std::max(Float(0), eumelanin ? texEval(eumelanin, ctx) : 0),
                        std::max(Float(0), pheomelanin ? texEval(pheomelanin, ctx) : 0))
                        .Sample(lambda);
        }

        // Offset along width
        Float h = -1 + 2 * ctx.uv[1];
        *bxdf = HairBxDF(h, e, sig_a, bm, bn, a);
        return BSDF(ctx.wo, ctx.n, ctx.ns, ctx.dpdus, bxdf, e);
    }